

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# System_test.cc
# Opt level: O0

void __thiscall
CounterSystem::update(CounterSystem *this,EntityManager *es,EventManager *events,TimeDelta param_4)

{
  bool bVar1;
  Counter *pCVar2;
  Entity entity;
  Iterator __end1;
  Iterator __begin1;
  View<Counter> *__range1;
  Handle counter;
  View<Counter> entities;
  Entity in_stack_ffffffffffffff58;
  Id this_00;
  _Base_bitset<1UL> in_stack_ffffffffffffff70;
  ViewIterator<entityx::EntityManager::BaseView<false>::Iterator,_false> local_70;
  BaseView<false> *local_48;
  BaseView<false> local_30 [3];
  
  local_30[0] = (BaseView<false>)
                entityx::EntityManager::entities_with_components<Counter>
                          ((EntityManager *)in_stack_ffffffffffffff70._M_w);
  entityx::ComponentHandle<Counter,_entityx::EntityManager>::ComponentHandle
            ((ComponentHandle<Counter,_entityx::EntityManager> *)0x2ae76c);
  local_48 = local_30;
  entityx::EntityManager::BaseView<false>::begin
            ((BaseView<false> *)in_stack_ffffffffffffff58.id_.id_.id_);
  entityx::EntityManager::BaseView<false>::end((BaseView<false> *)in_stack_ffffffffffffff70._M_w);
  while( true ) {
    this_00 = in_stack_ffffffffffffff58.id_.id_;
    bVar1 = entityx::EntityManager::
            ViewIterator<entityx::EntityManager::BaseView<false>::Iterator,_false>::operator!=
                      (&local_70,(Iterator *)&stack0xffffffffffffff68);
    if (!bVar1) break;
    in_stack_ffffffffffffff58 =
         entityx::EntityManager::
         ViewIterator<entityx::EntityManager::BaseView<false>::Iterator,_false>::operator*
                   ((ViewIterator<entityx::EntityManager::BaseView<false>::Iterator,_false> *)
                    this_00.id_);
    entityx::Entity::unpack<Counter>
              ((Entity *)in_stack_ffffffffffffff58.id_.id_.id_,
               (ComponentHandle<Counter,_entityx::EntityManager> *)
               in_stack_ffffffffffffff58.manager_);
    pCVar2 = entityx::ComponentHandle<Counter,_entityx::EntityManager>::operator->
                       ((ComponentHandle<Counter,_entityx::EntityManager> *)
                        in_stack_ffffffffffffff58.id_.id_.id_);
    pCVar2->counter = pCVar2->counter + 1;
    entityx::EntityManager::ViewIterator<entityx::EntityManager::BaseView<false>::Iterator,_false>::
    operator++((ViewIterator<entityx::EntityManager::BaseView<false>::Iterator,_false> *)
               in_stack_ffffffffffffff58.id_.id_.id_);
  }
  return;
}

Assistant:

void update(EntityManager &es, EventManager &events, TimeDelta) override {
    auto entities = es.entities_with_components<Counter>();
    Counter::Handle counter;
    for (auto entity : entities) {
      entity.unpack<Counter>(counter);
      counter->counter++;
    }
  }